

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::Instr::Unlink(Instr *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  pIVar1 = this->m_prev;
  pIVar1->m_next = this->m_next;
  if (this->m_next == (Instr *)0x0) {
    if (this->m_func->m_tailInstr != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x19b,"(this == this->m_func->m_tailInstr)",
                         "this == this->m_func->m_tailInstr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  else {
    this->m_next->m_prev = pIVar1;
  }
  if ((((this->globOptInstrString != (char16 *)0x0) &&
       (pIVar1 = this->m_next, pIVar1 != (Instr *)0x0)) &&
      (pIVar1->globOptInstrString == (char16 *)0x0)) &&
     ((pIVar1->m_kind != InstrKindLabel && (pIVar1->m_kind != InstrKindProfiledLabel)))) {
    pIVar1->globOptInstrString = this->globOptInstrString;
  }
  this->m_next = (Instr *)0x0;
  this->m_prev = (Instr *)0x0;
  return;
}

Assistant:

void
Instr::Unlink()
{
    m_prev->m_next = m_next;
    if (m_next)
    {
        m_next->m_prev = m_prev;
    }
    else
    {
        Assert(this == this->m_func->m_tailInstr);
    }

#if DBG_DUMP
    // Transferring the globOptInstrString to the next non-Label Instruction
    if(this->globOptInstrString != nullptr && m_next && m_next->globOptInstrString == nullptr && !m_next->IsLabelInstr())
    {
        m_next->globOptInstrString = this->globOptInstrString;
    }
#endif

#if DBG
    m_prev = nullptr;
    m_next = nullptr;
#endif
}